

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O1

cbtCollisionShape * __thiscall
cbtCollisionWorldImporter::convertCollisionShape
          (cbtCollisionWorldImporter *this,cbtCollisionShapeData *shapeData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  cbtOptimizedBvh **ppcVar7;
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined8 uVar17;
  int iVar18;
  int iVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar20;
  cbtOptimizedBvh *pcVar21;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  cbtCollisionShape *pcVar22;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  cbtCollisionShape **__s;
  cbtVector3 *pcVar23;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  _func_int **pp_Var24;
  char *pcVar25;
  cbtConvexHullShapeData *convexData;
  long lVar26;
  cbtTransform *pcVar27;
  cbtAlignedObjectArray<cbtCollisionShape_*> *pcVar28;
  long lVar29;
  char *pcVar30;
  int i;
  long lVar31;
  long lVar32;
  int i_1;
  long lVar33;
  cbtCapsuleShape *cap;
  cbtConvexHullShape *this_00;
  cbtAlignedObjectArray<float> radii;
  cbtAlignedObjectArray<cbtVector3> tmpPos;
  cbtAlignedObjectArray<cbtCollisionShape_*> local_98;
  undefined1 local_78 [16];
  cbtVector3 *local_68;
  bool local_60;
  undefined4 auStack_48 [6];
  undefined4 uVar11;
  undefined3 uVar13;
  undefined2 uVar15;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  pcVar28 = &local_98;
  uVar6 = shapeData->m_shapeType;
  this_00 = (cbtConvexHullShape *)0x0;
  if (0x21 < (int)uVar6) {
    if (uVar6 == 0x26) {
      return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
    }
    if (uVar6 == 0x25) {
      iVar18 = (*this->_vptr_cbtCollisionWorldImporter[0x16])(this);
      local_98.m_ownsMemory = true;
      local_98.m_data = (cbtCollisionShape **)0x0;
      local_98.m_size = 0;
      local_98.m_capacity = 0;
      if (0 < shapeData[1].m_shapeType) {
        lVar33 = 0;
        lVar26 = 0;
        do {
          pcVar22 = convertCollisionShape
                              (this,*(cbtCollisionShapeData **)
                                     (shapeData[1].m_name + lVar26 * 0x50 + 0x40));
          if (pcVar22 != (cbtCollisionShape *)0x0) {
            pcVar30 = shapeData[1].m_name;
            pcVar25 = pcVar30 + lVar33;
            lVar29 = 0;
            pcVar27 = (cbtTransform *)local_78;
            do {
              lVar31 = 0;
              do {
                (pcVar27->m_basis).m_el[0].m_floats[lVar31] = *(cbtScalar *)(pcVar25 + lVar31 * 4);
                lVar31 = lVar31 + 1;
              } while (lVar31 != 4);
              lVar29 = lVar29 + 1;
              pcVar27 = (cbtTransform *)((pcVar27->m_basis).m_el + 1);
              pcVar25 = pcVar25 + 0x10;
            } while (lVar29 != 3);
            lVar29 = 0xc;
            do {
              *(undefined4 *)(local_78 + lVar29 * 4) =
                   *(undefined4 *)(pcVar30 + lVar29 * 4 + lVar33);
              lVar29 = lVar29 + 1;
            } while (lVar29 != 0x10);
            cbtCompoundShape::addChildShape
                      ((cbtCompoundShape *)CONCAT44(extraout_var_07,iVar18),(cbtTransform *)local_78
                       ,pcVar22);
          }
          lVar26 = lVar26 + 1;
          lVar33 = lVar33 + 0x50;
        } while (lVar26 < shapeData[1].m_shapeType);
      }
      cbtAlignedObjectArray<cbtCollisionShape_*>::~cbtAlignedObjectArray(&local_98);
      return (cbtCollisionShape *)(cbtConvexHullShape *)CONCAT44(extraout_var_07,iVar18);
    }
    if (uVar6 != 0x22) {
      return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
    }
    local_78 = *(undefined1 (*) [16])(shapeData + 2);
    uVar9 = shapeData[1].m_shapeType;
    uVar10 = shapeData[1].m_padding[0];
    uVar12 = shapeData[1].m_padding[1];
    uVar14 = shapeData[1].m_padding[2];
    uVar16 = shapeData[1].m_padding[3];
    uVar15 = CONCAT11(uVar16,uVar14);
    uVar13 = CONCAT21(uVar15,uVar12);
    uVar11 = CONCAT31(uVar13,uVar10);
    local_98._0_4_ = SUB84(shapeData[1].m_name,0);
    local_98.m_size = (int)((ulong)shapeData[1].m_name >> 0x20);
    local_98.m_capacity = uVar9;
    local_98._12_4_ = uVar11;
    iVar18 = (*this->_vptr_cbtCollisionWorldImporter[4])((ulong)*(uint *)&shapeData[3].m_name,this);
    this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_00,iVar18);
    pp_Var24 = (this_00->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
               super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
               _vptr_cbtCollisionShape;
    goto LAB_008d63ff;
  }
  switch(uVar6) {
  case 8:
  case 9:
  case 0xb:
  case 0xd:
  case 0x14:
    goto switchD_008d5b89_caseD_8;
  case 10:
    iVar18 = shapeData[3].m_shapeType;
    if (iVar18 == 2) {
      iVar18 = (*this->_vptr_cbtCollisionWorldImporter[9])
                         (SUB648(ZEXT464(0x3f800000),0),SUB648(ZEXT464(0x3f800000),0),this);
      this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_13,iVar18);
    }
    else if (iVar18 == 1) {
      iVar18 = (*this->_vptr_cbtCollisionWorldImporter[8])
                         (SUB648(ZEXT464(0x3f800000),0),SUB648(ZEXT464(0x3f800000),0),this);
      this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_12,iVar18);
    }
    else if (iVar18 == 0) {
      iVar18 = (*this->_vptr_cbtCollisionWorldImporter[7])
                         (SUB648(ZEXT464(0x3f800000),0),SUB648(ZEXT464(0x3f800000),0),this);
      this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_06,iVar18);
    }
    else {
      puts("error: wrong up axis for cbtCapsuleShape");
      this_00 = (cbtConvexHullShape *)0x0;
    }
    if (this_00 != (cbtConvexHullShape *)0x0) {
      lVar26 = 8;
      do {
        *(undefined4 *)
         ((long)(&(this_00->super_cbtPolyhedralConvexAabbCachingShape).
                  super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                  m_implicitShapeDimensions + -2) + lVar26 * 4) =
             *(undefined4 *)(shapeData->m_padding + lVar26 * 4 + -0xc);
        lVar26 = lVar26 + 1;
      } while (lVar26 != 0xc);
      (this_00->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
      super_cbtConvexInternalShape.m_collisionMargin = *(cbtScalar *)&shapeData[3].m_name;
      lVar26 = 4;
      do {
        *(undefined4 *)
         ((long)(&(this_00->super_cbtPolyhedralConvexAabbCachingShape).
                  super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                  m_implicitShapeDimensions + -2) + lVar26 * 4) =
             *(undefined4 *)(shapeData->m_padding + lVar26 * 4 + -0xc);
        lVar26 = lVar26 + 1;
      } while (lVar26 != 8);
      *(int *)&(this_00->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
               super_cbtConvexInternalShape.field_0x44 = shapeData[3].m_shapeType;
    }
    break;
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    break;
  case 0x19:
    iVar18 = (*this->_vptr_cbtCollisionWorldImporter[0x14])(this,shapeData + 1);
    iVar18 = (*this->_vptr_cbtCollisionWorldImporter[0x19])(this,CONCAT44(extraout_var_02,iVar18));
    plVar20 = (long *)CONCAT44(extraout_var_03,iVar18);
    iVar18 = (**(code **)(*plVar20 + 0x38))(plVar20);
    if (iVar18 == 0) {
      this_00 = (cbtConvexHullShape *)0x0;
    }
    else {
      pcVar25 = shapeData[2].m_name;
      plVar20[1] = *(long *)&shapeData[1].m_shapeType;
      plVar20[2] = (long)pcVar25;
      if (shapeData[3].m_name == (char *)0x0) {
        pcVar21 = (cbtOptimizedBvh *)0x0;
      }
      else {
        local_78._0_8_ = shapeData[3].m_name;
        iVar19 = cbtHashMap<cbtHashPtr,_cbtOptimizedBvh_*>::findIndex
                           (&this->m_bvhMap,(cbtHashPtr *)local_78);
        ppcVar7 = (this->m_bvhMap).m_valueArray.m_data;
        if ((ppcVar7 == (cbtOptimizedBvh **)0x0 || iVar19 == -1) ||
           (pcVar21 = ppcVar7[iVar19], pcVar21 == (cbtOptimizedBvh *)0x0)) {
          iVar19 = (*this->_vptr_cbtCollisionWorldImporter[0x1a])(this);
          pcVar21 = (cbtOptimizedBvh *)CONCAT44(extraout_var_04,iVar19);
          (*(pcVar21->super_cbtQuantizedBvh)._vptr_cbtQuantizedBvh[5])(pcVar21,shapeData[3].m_name);
        }
      }
      lVar26._0_4_ = shapeData[3].m_shapeType;
      lVar26._4_1_ = shapeData[3].m_padding[0];
      lVar26._5_1_ = shapeData[3].m_padding[1];
      lVar26._6_1_ = shapeData[3].m_padding[2];
      lVar26._7_1_ = shapeData[3].m_padding[3];
      if (lVar26 != 0) {
        local_78._0_8_ = lVar26;
        iVar19 = cbtHashMap<cbtHashPtr,_cbtOptimizedBvh_*>::findIndex
                           (&this->m_bvhMap,(cbtHashPtr *)local_78);
        ppcVar7 = (this->m_bvhMap).m_valueArray.m_data;
        if ((ppcVar7 == (cbtOptimizedBvh **)0x0 || iVar19 == -1) ||
           (pcVar21 = ppcVar7[iVar19], pcVar21 == (cbtOptimizedBvh *)0x0)) {
          iVar19 = (*this->_vptr_cbtCollisionWorldImporter[0x1a])(this);
          pcVar21 = (cbtOptimizedBvh *)CONCAT44(extraout_var_14,iVar19);
          uVar17._0_4_ = shapeData[3].m_shapeType;
          uVar17._4_1_ = shapeData[3].m_padding[0];
          uVar17._5_1_ = shapeData[3].m_padding[1];
          uVar17._6_1_ = shapeData[3].m_padding[2];
          uVar17._7_1_ = shapeData[3].m_padding[3];
          (*(pcVar21->super_cbtQuantizedBvh)._vptr_cbtQuantizedBvh[6])(pcVar21,uVar17);
        }
      }
      iVar19 = (*this->_vptr_cbtCollisionWorldImporter[0x12])(this,plVar20,pcVar21);
      this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_15,iVar19);
      (*(this_00->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
        super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0xb])((ulong)(uint)shapeData[4].m_shapeType,this_00);
      if (shapeData[4].m_name != (char *)0x0) {
        iVar19 = (*this->_vptr_cbtCollisionWorldImporter[0x1b])(this);
        cbtTriangleInfoMap::deSerialize
                  ((cbtTriangleInfoMap *)CONCAT44(extraout_var_16,iVar19),
                   (cbtTriangleInfoMapData *)shapeData[4].m_name);
        *(cbtTriangleInfoMap **)
         (this_00->super_cbtPolyhedralConvexAabbCachingShape).m_localAabbMin.m_floats =
             (cbtTriangleInfoMap *)CONCAT44(extraout_var_16,iVar19);
      }
    }
    if (iVar18 == 0) {
      this_00 = (cbtConvexHullShape *)0x0;
    }
    break;
  case 0x1a:
    shapeData->m_shapeType = 0x19;
    pcVar22 = convertCollisionShape(this,shapeData);
    local_78 = *(undefined1 (*) [16])(shapeData + 5);
    iVar18 = (*this->_vptr_cbtCollisionWorldImporter[0x17])(this,pcVar22);
    this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_05,iVar18);
    break;
  default:
    if ((uVar6 != 0) && (uVar6 != 4)) {
      return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
    }
switchD_008d5b89_caseD_8:
    fVar3 = *(float *)&shapeData[2].m_name;
    fVar4 = *(float *)((long)&shapeData[2].m_name + 4);
    fVar5 = *(float *)&shapeData[3].m_name;
    if (0xd < uVar6) {
      if (uVar6 != 0x14) goto switchD_008d5bb8_caseD_1;
      iVar18 = (*this->_vptr_cbtCollisionWorldImporter[0xd])
                         ((ulong)(uint)(fVar5 + fVar3),(ulong)(uint)(fVar5 + fVar4),this);
      this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_01,iVar18);
      goto LAB_008d63d5;
    }
    switch(uVar6) {
    case 0:
      auVar8 = vinsertps_avx(ZEXT416((uint)(fVar5 + fVar3 / *(float *)&shapeData[1].m_name)),
                             ZEXT416((uint)(fVar5 + fVar4 / *(float *)((long)&shapeData[1].m_name +
                                                                      4))),0x10);
      local_78 = vinsertps_avx(auVar8,ZEXT416((uint)(fVar5 + (float)shapeData[2].m_shapeType /
                                                             (float)shapeData[1].m_shapeType)),0x28)
      ;
      iVar18 = (*this->_vptr_cbtCollisionWorldImporter[5])(this);
      this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var,iVar18);
      break;
    default:
switchD_008d5bb8_caseD_1:
      this_00 = (cbtConvexHullShape *)0x0;
      printf("error: cannot create shape type (%d)\n");
      break;
    case 4:
      iVar18 = shapeData[4].m_shapeType;
      lVar26 = (long)iVar18;
      local_60 = true;
      local_68 = (cbtVector3 *)0x0;
      local_78._4_8_ = 0;
      if (0 < lVar26) {
        pcVar23 = (cbtVector3 *)cbtAlignedAllocInternal(lVar26 << 4,0x10);
        if (0 < (long)(int)local_78._4_4_) {
          lVar33 = 0;
          do {
            *(undefined1 (*) [16])((long)pcVar23->m_floats + lVar33) =
                 *(undefined1 (*) [16])((long)local_68->m_floats + lVar33);
            lVar33 = lVar33 + 0x10;
          } while ((long)(int)local_78._4_4_ * 0x10 != lVar33);
        }
        if ((local_68 != (cbtVector3 *)0x0) && (local_60 == true)) {
          cbtAlignedFreeInternal(local_68);
        }
        local_78._8_4_ = iVar18;
        local_68 = pcVar23;
      }
      local_60 = true;
      local_78._4_4_ = iVar18;
      if (0 < iVar18) {
        lVar33._0_4_ = shapeData[3].m_shapeType;
        lVar33._4_1_ = shapeData[3].m_padding[0];
        lVar33._5_1_ = shapeData[3].m_padding[1];
        lVar33._6_1_ = shapeData[3].m_padding[2];
        lVar33._7_1_ = shapeData[3].m_padding[3];
        pcVar25 = shapeData[4].m_name;
        lVar31 = 0;
        pcVar23 = local_68;
        pcVar30 = pcVar25;
        lVar29 = lVar33;
        do {
          if (lVar33 != 0) {
            lVar32 = 0;
            do {
              pcVar23->m_floats[lVar32] = *(cbtScalar *)(lVar29 + lVar32 * 4);
              lVar32 = lVar32 + 1;
            } while (lVar32 != 4);
          }
          if (pcVar25 != (char *)0x0) {
            lVar32 = 0;
            do {
              pcVar23->m_floats[lVar32] = (float)*(double *)(pcVar30 + lVar32 * 8);
              lVar32 = lVar32 + 1;
            } while (lVar32 != 4);
          }
          lVar31 = lVar31 + 1;
          pcVar23 = pcVar23 + 1;
          lVar29 = lVar29 + 0x10;
          pcVar30 = pcVar30 + 0x20;
        } while (lVar31 != lVar26);
      }
      iVar19 = (*this->_vptr_cbtCollisionWorldImporter[0x15])(this);
      this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_10,iVar19);
      if (0 < iVar18) {
        lVar33 = 0;
        do {
          cbtConvexHullShape::addPoint
                    (this_00,(cbtVector3 *)((long)local_68->m_floats + lVar33),true);
          lVar33 = lVar33 + 0x10;
        } while (lVar26 * 0x10 != lVar33);
      }
      (*(this_00->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
        super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0xb])((ulong)*(uint *)&shapeData[3].m_name,this_00);
      goto LAB_008d63cb;
    case 8:
      iVar18 = (*this->_vptr_cbtCollisionWorldImporter[6])((ulong)(uint)fVar3,this);
      this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_08,iVar18);
      break;
    case 9:
      uVar6 = *(uint *)&shapeData[4].m_name;
      lVar26 = (long)(int)uVar6;
      local_60 = true;
      local_68 = (cbtVector3 *)0x0;
      local_78._4_8_ = 0;
      local_98.m_ownsMemory = true;
      local_98.m_data = (cbtCollisionShape **)0x0;
      local_98.m_size = 0;
      local_98.m_capacity = 0;
      if ((-1 < lVar26) && (uVar6 != 0)) {
        __s = (cbtCollisionShape **)cbtAlignedAllocInternal(lVar26 * 4,0x10);
        if (0 < (long)local_98.m_size) {
          lVar33 = 0;
          do {
            *(undefined4 *)((long)__s + lVar33 * 4) =
                 *(undefined4 *)((long)local_98.m_data + lVar33 * 4);
            lVar33 = lVar33 + 1;
          } while (local_98.m_size != lVar33);
        }
        if ((local_98.m_data != (cbtCollisionShape **)0x0) && (local_98.m_ownsMemory == true)) {
          cbtAlignedFreeInternal(local_98.m_data);
        }
        local_98.m_ownsMemory = true;
        local_98.m_capacity = uVar6;
        local_98.m_data = __s;
        if (uVar6 != 0) {
          memset(__s,0,lVar26 * 4);
        }
      }
      local_98.m_size = uVar6;
      if ((((int)local_78._4_4_ <= (int)uVar6) && ((int)local_78._4_4_ < (int)uVar6)) &&
         ((int)local_78._8_4_ < (int)uVar6)) {
        if (uVar6 == 0) {
          pcVar23 = (cbtVector3 *)0x0;
        }
        else {
          pcVar23 = (cbtVector3 *)cbtAlignedAllocInternal(lVar26 << 4,0x10);
        }
        if (0 < (long)(int)local_78._4_4_) {
          lVar33 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_68->m_floats + lVar33);
            uVar17 = puVar1[1];
            puVar2 = (undefined8 *)((long)pcVar23->m_floats + lVar33);
            *puVar2 = *puVar1;
            puVar2[1] = uVar17;
            lVar33 = lVar33 + 0x10;
          } while ((long)(int)local_78._4_4_ * 0x10 != lVar33);
        }
        if ((local_68 != (cbtVector3 *)0x0) && (local_60 == true)) {
          cbtAlignedFreeInternal(local_68);
        }
        local_60 = true;
        local_78._8_4_ = uVar6;
        local_68 = pcVar23;
      }
      local_78._4_4_ = uVar6;
      if (0 < (int)uVar6) {
        lVar33 = *(long *)&shapeData[3].m_shapeType;
        lVar31 = 0;
        pcVar23 = local_68;
        lVar29 = lVar33;
        do {
          lVar32 = 0;
          do {
            pcVar23->m_floats[lVar32] = *(cbtScalar *)(lVar29 + lVar32 * 4);
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          *(undefined4 *)((long)local_98.m_data + lVar31 * 4) =
               *(undefined4 *)(lVar33 + 0x10 + lVar31 * 0x14);
          lVar31 = lVar31 + 1;
          pcVar23 = pcVar23 + 1;
          lVar29 = lVar29 + 0x14;
        } while (lVar31 != lVar26);
      }
      iVar18 = (*this->_vptr_cbtCollisionWorldImporter[0x18])
                         (this,local_68,local_98.m_data,(ulong)uVar6);
      this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_21,iVar18);
      cbtAlignedObjectArray<float>::~cbtAlignedObjectArray
                ((cbtAlignedObjectArray<float> *)&local_98);
LAB_008d63cb:
      cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray
                ((cbtAlignedObjectArray<cbtVector3> *)local_78);
      break;
    case 0xb:
      iVar18 = shapeData[3].m_shapeType;
      if (iVar18 == 2) {
        iVar18 = (*this->_vptr_cbtCollisionWorldImporter[0x10])((ulong)(uint)fVar3,this);
        this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_20,iVar18);
      }
      else if (iVar18 == 1) {
        iVar18 = (*this->_vptr_cbtCollisionWorldImporter[0xf])
                           ((ulong)(uint)fVar3,(ulong)(uint)fVar4,this);
        this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_19,iVar18);
      }
      else if (iVar18 == 0) {
        iVar18 = (*this->_vptr_cbtCollisionWorldImporter[0xe])
                           ((ulong)(uint)fVar4,(ulong)(uint)fVar3,this);
        this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_11,iVar18);
      }
      else {
        pcVar25 = "unknown Cone up axis";
LAB_008d62eb:
        puts(pcVar25);
        this_00 = (cbtConvexHullShape *)0x0;
      }
      break;
    case 0xd:
      fVar3 = fVar5 + fVar3;
      iVar18 = shapeData[3].m_shapeType;
      if (iVar18 == 2) {
        iVar18 = (*this->_vptr_cbtCollisionWorldImporter[0xc])
                           ((ulong)(uint)fVar3,
                            (ulong)(uint)(fVar5 + (float)shapeData[2].m_shapeType),this);
        this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_18,iVar18);
      }
      else if (iVar18 == 1) {
        iVar18 = (*this->_vptr_cbtCollisionWorldImporter[0xb])((ulong)(uint)fVar3,this);
        this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_17,iVar18);
      }
      else {
        if (iVar18 != 0) {
          pcVar25 = "unknown Cylinder up axis";
          goto LAB_008d62eb;
        }
        iVar18 = (*this->_vptr_cbtCollisionWorldImporter[10])
                           ((ulong)(uint)(fVar5 + fVar4),(ulong)(uint)fVar3,this);
        this_00 = (cbtConvexHullShape *)CONCAT44(extraout_var_09,iVar18);
      }
    }
LAB_008d63d5:
    if (this_00 != (cbtConvexHullShape *)0x0) {
      (*(this_00->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
        super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0xb])((ulong)*(uint *)&shapeData[3].m_name,this_00);
      local_78 = *(undefined1 (*) [16])(shapeData + 1);
      pcVar28 = (cbtAlignedObjectArray<cbtCollisionShape_*> *)local_78;
      pp_Var24 = (this_00->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape
                 .super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
                 _vptr_cbtCollisionShape;
LAB_008d63ff:
      (*pp_Var24[6])(this_00,pcVar28);
    }
  }
  return (cbtCollisionShape *)this_00;
}

Assistant:

cbtCollisionShape* cbtCollisionWorldImporter::convertCollisionShape(cbtCollisionShapeData* shapeData)
{
	cbtCollisionShape* shape = 0;

	switch (shapeData->m_shapeType)
	{
		case STATIC_PLANE_PROXYTYPE:
		{
			cbtStaticPlaneShapeData* planeData = (cbtStaticPlaneShapeData*)shapeData;
			cbtVector3 planeNormal, localScaling;
			planeNormal.deSerializeFloat(planeData->m_planeNormal);
			localScaling.deSerializeFloat(planeData->m_localScaling);
			shape = createPlaneShape(planeNormal, planeData->m_planeConstant);
			shape->setLocalScaling(localScaling);

			break;
		}
		case SCALED_TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			cbtScaledTriangleMeshShapeData* scaledMesh = (cbtScaledTriangleMeshShapeData*)shapeData;
			cbtCollisionShapeData* colShapeData = (cbtCollisionShapeData*)&scaledMesh->m_trimeshShapeData;
			colShapeData->m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
			cbtCollisionShape* childShape = convertCollisionShape(colShapeData);
			cbtBvhTriangleMeshShape* meshShape = (cbtBvhTriangleMeshShape*)childShape;
			cbtVector3 localScaling;
			localScaling.deSerializeFloat(scaledMesh->m_localScaling);

			shape = createScaledTrangleMeshShape(meshShape, localScaling);
			break;
		}
#ifdef SUPPORT_GIMPACT_SHAPE_IMPORT
		case GIMPACT_SHAPE_PROXYTYPE:
		{
			cbtGImpactMeshShapeData* gimpactData = (cbtGImpactMeshShapeData*)shapeData;
			if (gimpactData->m_gimpactSubType == CONST_GIMPACT_TRIMESH_SHAPE)
			{
				cbtStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&gimpactData->m_meshInterface);
				cbtTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);

				cbtGImpactMeshShape* gimpactShape = createGimpactShape(meshInterface);
				cbtVector3 localScaling;
				localScaling.deSerializeFloat(gimpactData->m_localScaling);
				gimpactShape->setLocalScaling(localScaling);
				gimpactShape->setMargin(cbtScalar(gimpactData->m_collisionMargin));
				gimpactShape->updateBound();
				shape = gimpactShape;
			}
			else
			{
				printf("unsupported gimpact sub type\n");
			}
			break;
		}
#endif  //SUPPORT_GIMPACT_SHAPE_IMPORT                                                                        \
		//The cbtCapsuleShape* API has issue passing the margin/scaling/halfextents unmodified through the API \
		//so deal with this
		case CAPSULE_SHAPE_PROXYTYPE:
		{
			cbtCapsuleShapeData* capData = (cbtCapsuleShapeData*)shapeData;

			switch (capData->m_upAxis)
			{
				case 0:
				{
					shape = createCapsuleShapeX(1, 1);
					break;
				}
				case 1:
				{
					shape = createCapsuleShapeY(1, 1);
					break;
				}
				case 2:
				{
					shape = createCapsuleShapeZ(1, 1);
					break;
				}
				default:
				{
					printf("error: wrong up axis for cbtCapsuleShape\n");
				}
			};
			if (shape)
			{
				cbtCapsuleShape* cap = (cbtCapsuleShape*)shape;
				cap->deSerializeFloat(capData);
			}
			break;
		}
		case CYLINDER_SHAPE_PROXYTYPE:
        case CYLSHELL_SHAPE_PROXYTYPE:
		case CONE_SHAPE_PROXYTYPE:
		case BOX_SHAPE_PROXYTYPE:
		case SPHERE_SHAPE_PROXYTYPE:
		case MULTI_SPHERE_SHAPE_PROXYTYPE:
		case CONVEX_HULL_SHAPE_PROXYTYPE:
		{
			cbtConvexInternalShapeData* bsd = (cbtConvexInternalShapeData*)shapeData;
			cbtVector3 implicitShapeDimensions;
			implicitShapeDimensions.deSerializeFloat(bsd->m_implicitShapeDimensions);
			cbtVector3 localScaling;
			localScaling.deSerializeFloat(bsd->m_localScaling);
			cbtVector3 margin(bsd->m_collisionMargin, bsd->m_collisionMargin, bsd->m_collisionMargin);
			switch (shapeData->m_shapeType)
			{
				case BOX_SHAPE_PROXYTYPE:
				{
					cbtBoxShape* box = (cbtBoxShape*)createBoxShape(implicitShapeDimensions / localScaling + margin);
					//box->initializePolyhedralFeatures();
					shape = box;

					break;
				}
				case SPHERE_SHAPE_PROXYTYPE:
				{
					shape = createSphereShape(implicitShapeDimensions.getX());
					break;
				}

				case CYLINDER_SHAPE_PROXYTYPE:
				{
					cbtCylinderShapeData* cylData = (cbtCylinderShapeData*)shapeData;
					cbtVector3 halfExtents = implicitShapeDimensions + margin;
					switch (cylData->m_upAxis)
					{
						case 0:
						{
							shape = createCylinderShapeX(halfExtents.getY(), halfExtents.getX());
							break;
						}
						case 1:
						{
							shape = createCylinderShapeY(halfExtents.getX(), halfExtents.getY());
							break;
						}
						case 2:
						{
							shape = createCylinderShapeZ(halfExtents.getX(), halfExtents.getZ());
							break;
						}
						default:
						{
							printf("unknown Cylinder up axis\n");
						}
					};

					break;
				}

                case CYLSHELL_SHAPE_PROXYTYPE: { /* ***CHRONO*** */
                    ////cbtCylindricalShellShapeData* cylData = (cbtCylindricalShellShapeData*)shapeData;
                    cbtVector3 halfExtents = implicitShapeDimensions + margin;
                    cbtScalar radius = halfExtents.getX();
                    cbtScalar hlen = halfExtents.getY();
					shape = createCylindricalShellShape(radius, hlen);

                    break;
                }

				case CONE_SHAPE_PROXYTYPE:
				{
					cbtConeShapeData* conData = (cbtConeShapeData*)shapeData;
					cbtVector3 halfExtents = implicitShapeDimensions;  //+margin;
					switch (conData->m_upIndex)
					{
						case 0:
						{
							shape = createConeShapeX(halfExtents.getY(), halfExtents.getX());
							break;
						}
						case 1:
						{
							shape = createConeShapeY(halfExtents.getX(), halfExtents.getY());
							break;
						}
						case 2:
						{
							shape = createConeShapeZ(halfExtents.getX(), halfExtents.getZ());
							break;
						}
						default:
						{
							printf("unknown Cone up axis\n");
						}
					};

					break;
				}
				case MULTI_SPHERE_SHAPE_PROXYTYPE:
				{
					cbtMultiSphereShapeData* mss = (cbtMultiSphereShapeData*)bsd;
					int numSpheres = mss->m_localPositionArraySize;

					cbtAlignedObjectArray<cbtVector3> tmpPos;
					cbtAlignedObjectArray<cbtScalar> radii;
					radii.resize(numSpheres);
					tmpPos.resize(numSpheres);
					int i;
					for (i = 0; i < numSpheres; i++)
					{
						tmpPos[i].deSerializeFloat(mss->m_localPositionArrayPtr[i].m_pos);
						radii[i] = mss->m_localPositionArrayPtr[i].m_radius;
					}
					shape = createMultiSphereShape(&tmpPos[0], &radii[0], numSpheres);
					break;
				}
				case CONVEX_HULL_SHAPE_PROXYTYPE:
				{
					//	int sz = sizeof(cbtConvexHullShapeData);
					//	int sz2 = sizeof(cbtConvexInternalShapeData);
					//	int sz3 = sizeof(cbtCollisionShapeData);
					cbtConvexHullShapeData* convexData = (cbtConvexHullShapeData*)bsd;
					int numPoints = convexData->m_numUnscaledPoints;

					cbtAlignedObjectArray<cbtVector3> tmpPoints;
					tmpPoints.resize(numPoints);
					int i;
					for (i = 0; i < numPoints; i++)
					{
#ifdef BT_USE_DOUBLE_PRECISION
						if (convexData->m_unscaledPointsDoublePtr)
							tmpPoints[i].deSerialize(convexData->m_unscaledPointsDoublePtr[i]);
						if (convexData->m_unscaledPointsFloatPtr)
							tmpPoints[i].deSerializeFloat(convexData->m_unscaledPointsFloatPtr[i]);
#else
						if (convexData->m_unscaledPointsFloatPtr)
							tmpPoints[i].deSerialize(convexData->m_unscaledPointsFloatPtr[i]);
						if (convexData->m_unscaledPointsDoublePtr)
							tmpPoints[i].deSerializeDouble(convexData->m_unscaledPointsDoublePtr[i]);
#endif  //BT_USE_DOUBLE_PRECISION
					}
					cbtConvexHullShape* hullShape = createConvexHullShape();
					for (i = 0; i < numPoints; i++)
					{
						hullShape->addPoint(tmpPoints[i]);
					}
					hullShape->setMargin(bsd->m_collisionMargin);
					//hullShape->initializePolyhedralFeatures();
					shape = hullShape;
					break;
				}
				default:
				{
					printf("error: cannot create shape type (%d)\n", shapeData->m_shapeType);
				}
			}

			if (shape)
			{
				shape->setMargin(bsd->m_collisionMargin);

				cbtVector3 localScaling;
				localScaling.deSerializeFloat(bsd->m_localScaling);
				shape->setLocalScaling(localScaling);
			}
			break;
		}
		case TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			cbtTriangleMeshShapeData* trimesh = (cbtTriangleMeshShapeData*)shapeData;
			cbtStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&trimesh->m_meshInterface);
			cbtTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);
			if (!meshInterface->getNumSubParts())
			{
				return 0;
			}

			cbtVector3 scaling;
			scaling.deSerializeFloat(trimesh->m_meshInterface.m_scaling);
			meshInterface->setScaling(scaling);

			cbtOptimizedBvh* bvh = 0;
#if 1
			if (trimesh->m_quantizedFloatBvh)
			{
				cbtOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedFloatBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				}
				else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeFloat(*trimesh->m_quantizedFloatBvh);
				}
			}
			if (trimesh->m_quantizedDoubleBvh)
			{
				cbtOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedDoubleBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				}
				else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeDouble(*trimesh->m_quantizedDoubleBvh);
				}
			}
#endif

			cbtBvhTriangleMeshShape* trimeshShape = createBvhTriangleMeshShape(meshInterface, bvh);
			trimeshShape->setMargin(trimesh->m_collisionMargin);
			shape = trimeshShape;

			if (trimesh->m_triangleInfoMap)
			{
				cbtTriangleInfoMap* map = createTriangleInfoMap();
				map->deSerialize(*trimesh->m_triangleInfoMap);
				trimeshShape->setTriangleInfoMap(map);

#ifdef USE_INTERNAL_EDGE_UTILITY
				gContactAddedCallback = cbtAdjustInternalEdgeContactsCallback;
#endif  //USE_INTERNAL_EDGE_UTILITY
			}

			//printf("trimesh->m_collisionMargin=%f\n",trimesh->m_collisionMargin);
			break;
		}
		case COMPOUND_SHAPE_PROXYTYPE:
		{
			cbtCompoundShapeData* compoundData = (cbtCompoundShapeData*)shapeData;
			cbtCompoundShape* compoundShape = createCompoundShape();

			//cbtCompoundShapeChildData* childShapeDataArray = &compoundData->m_childShapePtr[0];

			cbtAlignedObjectArray<cbtCollisionShape*> childShapes;
			for (int i = 0; i < compoundData->m_numChildShapes; i++)
			{
				//cbtCompoundShapeChildData* ptr = &compoundData->m_childShapePtr[i];

				cbtCollisionShapeData* cd = compoundData->m_childShapePtr[i].m_childShape;

				cbtCollisionShape* childShape = convertCollisionShape(cd);
				if (childShape)
				{
					cbtTransform localTransform;
					localTransform.deSerializeFloat(compoundData->m_childShapePtr[i].m_transform);
					compoundShape->addChildShape(localTransform, childShape);
				}
				else
				{
#ifdef _DEBUG
					printf("error: couldn't create childShape for compoundShape\n");
#endif
				}
			}
			shape = compoundShape;

			break;
		}
		case SOFTBODY_SHAPE_PROXYTYPE:
		{
			return 0;
		}
		default:
		{
#ifdef _DEBUG
			printf("unsupported shape type (%d)\n", shapeData->m_shapeType);
#endif
		}
	}

	return shape;
}